

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_perform_subscription_callback(void *s_,void *msg_)

{
  fio_defer_task_s task;
  fio_defer_task_s task_00;
  int iVar1;
  undefined4 local_a8 [2];
  fio_msg_client_s m;
  fio_msg_internal_s *msg;
  subscription_s *s;
  void *msg__local;
  void *s__local;
  
  iVar1 = fio_trylock((fio_lock_i *)((long)s_ + 0x40));
  if (iVar1 == 0) {
    local_a8[0] = *(undefined4 *)((long)msg_ + 0x38);
    m.msg._0_8_ = *msg_;
    m.msg.channel.capa = *(size_t *)((long)msg_ + 8);
    m.msg.channel.len = *(size_t *)((long)msg_ + 0x10);
    m.msg.channel.data = *(char **)((long)msg_ + 0x18);
    m.msg.msg.capa = *(size_t *)((long)msg_ + 0x20);
    m.msg.msg.len = *(size_t *)((long)msg_ + 0x28);
    m.msg.msg.data = *(char **)((long)s_ + 0x28);
    m.msg.udata1 = *(void **)((long)s_ + 0x30);
    m.msg.udata2._0_1_ = 0;
    m.msg.is_json = '\0';
    m.msg._73_7_ = 0;
    m.marker = *(size_t *)((long)msg_ + 0x40);
    m.meta_len = (long)msg_ + 0x48;
    m.meta = (fio_msg_metadata_s *)msg_;
    if (*(long *)((long)s_ + 0x18) != 0) {
      (**(code **)((long)s_ + 0x18))(local_a8);
    }
    fio_unlock((fio_lock_i *)((long)s_ + 0x40));
    if (m.msg._72_8_ == 0) {
      fio_msg_internal_free((fio_msg_internal_s *)m.meta);
      fio_subscription_free((subscription_s *)s_);
    }
    else {
      task_00.arg1 = s_;
      task_00.func = fio_perform_subscription_callback;
      task_00.arg2 = msg_;
      fio_defer_push_task_fn(task_00,&task_queue_normal);
      fio_defer_thread_signal();
    }
  }
  else {
    task.arg1 = s_;
    task.func = fio_perform_subscription_callback;
    task.arg2 = msg_;
    fio_defer_push_task_fn(task,&task_queue_normal);
    fio_defer_thread_signal();
  }
  return;
}

Assistant:

static void fio_perform_subscription_callback(void *s_, void *msg_) {
  subscription_s *s = s_;
  if (fio_trylock(&s->lock)) {
    fio_defer_push_task(fio_perform_subscription_callback, s_, msg_);
    return;
  }
  fio_msg_internal_s *msg = (fio_msg_internal_s *)msg_;
  fio_msg_client_s m = {
      .msg =
          {
              .channel = msg->channel,
              .msg = msg->data,
              .filter = msg->filter,
              .udata1 = s->udata1,
              .udata2 = s->udata2,
          },
      .meta_len = msg->meta_len,
      .meta = msg->meta,
      .marker = 0,
  };
  if (s->on_message) {
    /* the on_message callback is removed when a subscription is canceled. */
    s->on_message(&m.msg);
  }
  fio_unlock(&s->lock);
  if (m.marker) {
    fio_defer_push_task(fio_perform_subscription_callback, s_, msg_);
    return;
  }
  fio_msg_internal_free(msg);
  fio_subscription_free(s);
}